

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O3

yo_scene * yo__load_mtl(yo_scene *scene,char *filename)

{
  byte *__s;
  double dVar1;
  double dVar2;
  double dVar3;
  byte *__s1;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  FILE *__stream;
  char *pcVar9;
  yo_material *pyVar10;
  size_t sVar11;
  byte *pbVar12;
  char *mtok [10];
  char mline [4096];
  byte *local_1088 [9];
  byte local_1039 [4105];
  
  __stream = fopen(filename,"rt");
  if (__stream == (FILE *)0x0) {
    scene = (yo_scene *)0x0;
  }
  else {
    __s = local_1039 + 1;
    pcVar9 = fgets((char *)__s,0x1000,__stream);
    if (pcVar9 != (char *)0x0) {
      pyVar10 = (yo_material *)0x0;
      do {
        if (local_1039[1] != 0) {
          iVar6 = 0;
          pbVar12 = __s;
          bVar4 = local_1039[1];
          do {
            iVar5 = isspace((int)(char)bVar4);
            if (iVar5 == 0) {
              if ((iVar6 == 0) || (pbVar12[-1] == 0)) {
                local_1088[iVar6] = pbVar12;
                iVar6 = iVar6 + 1;
              }
            }
            else {
              *pbVar12 = 0;
            }
            __s1 = local_1088[0];
            bVar4 = pbVar12[1];
          } while ((bVar4 != 0) && (pbVar12 = pbVar12 + 1, iVar6 < 10));
          if (iVar6 != 0) {
            bVar4 = *local_1088[0];
            if ((bVar4 != 0x23) && (bVar4 != 0x2f)) {
              iVar6 = strcmp((char *)local_1088[0],"newmtl");
              pbVar12 = local_1088[1];
              if (iVar6 == 0) {
                uVar7 = scene->nmaterials;
                if (uVar7 == 0xffffffff) {
                  iVar6 = 0;
LAB_00170508:
                  uVar8 = uVar7 - 1 >> 1 | uVar7 - 1;
                  uVar8 = uVar8 >> 2 | uVar8;
                  uVar8 = uVar8 >> 4 | uVar8;
                  uVar8 = uVar8 >> 8 | uVar8;
                  pyVar10 = scene->materials;
                  if ((int)((uVar8 >> 0x10 | uVar8) + 1) < iVar6) {
                    if (uVar7 != 0xffffffff) goto LAB_00170544;
                    sVar11 = 0;
                    goto LAB_00170571;
                  }
                }
                else {
                  if (uVar7 != 0) {
                    uVar8 = uVar7 >> 1 | uVar7;
                    uVar8 = uVar8 >> 2 | uVar8;
                    uVar8 = uVar8 >> 4 | uVar8;
                    uVar8 = uVar8 >> 8 | uVar8;
                    iVar6 = (uVar8 >> 0x10 | uVar8) + 1;
                    goto LAB_00170508;
                  }
                  pyVar10 = scene->materials;
LAB_00170544:
                  uVar7 = uVar7 >> 1 | uVar7;
                  uVar7 = uVar7 >> 2 | uVar7;
                  uVar7 = uVar7 >> 4 | uVar7;
                  uVar7 = uVar7 >> 8 | uVar7;
                  sVar11 = (long)(int)((uVar7 >> 0x10 | uVar7) + 1) * 0xe8;
LAB_00170571:
                  pyVar10 = (yo_material *)realloc(pyVar10,sVar11);
                  scene->materials = pyVar10;
                  uVar7 = scene->nmaterials;
                  if ((long)(int)uVar7 == -1) {
                    iVar6 = 0;
                  }
                  else {
                    uVar8 = uVar7 >> 1 | uVar7;
                    uVar8 = uVar8 >> 2 | uVar8;
                    uVar8 = uVar8 >> 4 | uVar8;
                    uVar8 = uVar8 >> 8 | uVar8;
                    iVar6 = (uVar8 >> 0x10 | uVar8) + 1;
                  }
                  memset(pyVar10 + (int)uVar7,0,(long)(int)(iVar6 - uVar7) * 0xe8);
                }
                scene->nmaterials = uVar7 + 1;
                if (pbVar12 == (byte *)0x0) {
                  pcVar9 = (char *)0x0;
                }
                else {
                  sVar11 = strlen((char *)pbVar12);
                  pcVar9 = (char *)calloc(sVar11 + 1,1);
                  strcpy(pcVar9,(char *)pbVar12);
                }
                pyVar10 = pyVar10 + (long)(int)(uVar7 + 1) + -1;
                pyVar10->name = pcVar9;
              }
              else {
                iVar6 = strcmp((char *)__s1,"illum");
                if (iVar6 == 0) {
                  iVar6 = atoi((char *)local_1088[1]);
                  pyVar10->illum = iVar6;
                }
                else if (bVar4 < 0x54) {
                  if (bVar4 == 0x4b) {
                    if ((__s1[1] == 0x65) && (__s1[2] == 0)) {
                      dVar1 = atof((char *)local_1088[1]);
                      dVar2 = atof((char *)local_1088[2]);
                      dVar3 = atof((char *)local_1088[3]);
                      *(ulong *)pyVar10->ke = CONCAT44((float)dVar2,(float)dVar1);
                      pyVar10->ke[2] = (float)dVar3;
                    }
                    else if ((__s1[1] == 0x61) && (__s1[2] == 0)) {
                      dVar1 = atof((char *)local_1088[1]);
                      dVar2 = atof((char *)local_1088[2]);
                      dVar3 = atof((char *)local_1088[3]);
                      *(ulong *)pyVar10->ka = CONCAT44((float)dVar2,(float)dVar1);
                      pyVar10->ka[2] = (float)dVar3;
                    }
                    else if ((__s1[1] == 100) && (__s1[2] == 0)) {
                      dVar1 = atof((char *)local_1088[1]);
                      dVar2 = atof((char *)local_1088[2]);
                      dVar3 = atof((char *)local_1088[3]);
                      *(ulong *)pyVar10->kd = CONCAT44((float)dVar2,(float)dVar1);
                      pyVar10->kd[2] = (float)dVar3;
                    }
                    else if ((__s1[1] == 0x73) && (__s1[2] == 0)) {
                      dVar1 = atof((char *)local_1088[1]);
                      dVar2 = atof((char *)local_1088[2]);
                      dVar3 = atof((char *)local_1088[3]);
                      *(ulong *)pyVar10->ks = CONCAT44((float)dVar2,(float)dVar1);
                      pyVar10->ks[2] = (float)dVar3;
                    }
                    else {
                      if ((__s1[1] != 0x72) || (__s1[2] != 0)) goto LAB_001706d1;
                      dVar1 = atof((char *)local_1088[1]);
                      dVar2 = atof((char *)local_1088[2]);
                      dVar3 = atof((char *)local_1088[3]);
                      *(ulong *)pyVar10->kr = CONCAT44((float)dVar2,(float)dVar1);
                      pyVar10->kr[2] = (float)dVar3;
                    }
                  }
                  else {
                    if (bVar4 != 0x4e) goto LAB_001706d1;
                    if ((__s1[1] == 0x73) && (__s1[2] == 0)) {
                      dVar1 = atof((char *)local_1088[1]);
                      pyVar10->ns = (float)dVar1;
                    }
                    else {
                      if ((__s1[1] != 0x69) || (__s1[2] != 0)) goto LAB_001706d1;
                      dVar1 = atof((char *)local_1088[1]);
                      pyVar10->ior = (float)dVar1;
                    }
                  }
                }
                else if (bVar4 == 0x54) {
                  if ((__s1[1] != 0x72) || (__s1[2] != 0)) goto LAB_001706d1;
                  dVar1 = atof((char *)local_1088[1]);
                  dVar2 = atof((char *)local_1088[2]);
                  dVar3 = atof((char *)local_1088[3]);
                  *(ulong *)pyVar10->kt = CONCAT44((float)dVar2,(float)dVar1);
                  pyVar10->kt[2] = (float)dVar3;
                }
                else if ((bVar4 == 100) && (__s1[1] == 0)) {
                  dVar1 = atof((char *)local_1088[1]);
                  pyVar10->op = (float)dVar1;
                }
                else {
LAB_001706d1:
                  iVar6 = strcmp((char *)__s1,"map_Ke");
                  if (iVar6 == 0) {
                    pcVar9 = yo__strdup((char *)local_1088[1]);
                    pyVar10->ke_txt = pcVar9;
                  }
                  else {
                    iVar6 = strcmp((char *)__s1,"map_Ka");
                    if (iVar6 == 0) {
                      pcVar9 = yo__strdup((char *)local_1088[1]);
                      pyVar10->ka_txt = pcVar9;
                    }
                    else {
                      iVar6 = strcmp((char *)__s1,"map_Kd");
                      if (iVar6 == 0) {
                        pcVar9 = yo__strdup((char *)local_1088[1]);
                        pyVar10->kd_txt = pcVar9;
                      }
                      else {
                        iVar6 = strcmp((char *)__s1,"map_Ks");
                        if (iVar6 == 0) {
                          pcVar9 = yo__strdup((char *)local_1088[1]);
                          pyVar10->ks_txt = pcVar9;
                        }
                        else {
                          iVar6 = strcmp((char *)__s1,"map_Kr");
                          if (iVar6 == 0) {
                            pcVar9 = yo__strdup((char *)local_1088[1]);
                            pyVar10->kr_txt = pcVar9;
                          }
                          else {
                            iVar6 = strcmp((char *)__s1,"map_Tr");
                            if (iVar6 == 0) {
                              pcVar9 = yo__strdup((char *)local_1088[1]);
                              pyVar10->kt_txt = pcVar9;
                            }
                            else {
                              iVar6 = strcmp((char *)__s1,"map_Ns");
                              if (iVar6 == 0) {
                                pcVar9 = yo__strdup((char *)local_1088[1]);
                                pyVar10->ns_txt = pcVar9;
                              }
                              else {
                                iVar6 = strcmp((char *)__s1,"map_d");
                                if (iVar6 == 0) {
                                  pcVar9 = yo__strdup((char *)local_1088[1]);
                                  pyVar10->op_txt = pcVar9;
                                }
                                else {
                                  iVar6 = strcmp((char *)__s1,"map_Ni");
                                  if (iVar6 == 0) {
                                    pcVar9 = yo__strdup((char *)local_1088[1]);
                                    pyVar10->ior_txt = pcVar9;
                                  }
                                  else {
                                    iVar6 = strcmp((char *)__s1,"map_bump");
                                    if (iVar6 == 0) {
                                      pcVar9 = yo__strdup((char *)local_1088[1]);
                                      pyVar10->bump_txt = pcVar9;
                                    }
                                    else {
                                      iVar6 = strcmp((char *)__s1,"map_disp");
                                      if (iVar6 == 0) {
                                        pcVar9 = yo__strdup((char *)local_1088[1]);
                                        pyVar10->disp_txt = pcVar9;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pcVar9 = fgets((char *)__s,0x1000,__stream);
      } while (pcVar9 != (char *)0x0);
    }
    fclose(__stream);
  }
  return scene;
}

Assistant:

static inline yo_scene*
yo__load_mtl(yo_scene* scene, const char* filename) {
    FILE* mfile = fopen(filename, "rt");
    if (!mfile) return 0;

    char mline[4096];
    char* mtok[10];
    int mlinenum = 0;

    yo_material* mat = 0;

    // foreach line, splits the line by whitespaces and parses the data
    // directly in the material
    while (fgets(mline, 4096, mfile)) {
        mlinenum += 1;
        int mntok = yo__splitws(mline, mtok, 10);

        if (!mntok) {
            continue;
        } else if (mtok[0][0] == '#' || mtok[0][0] == '/') {
            continue;
        } else if (!strcmp(mtok[0], "newmtl")) {
            yo__add_empty_material(scene, mtok[1]);
            mat = &scene->materials[scene->nmaterials - 1];
        } else if (!strcmp(mtok[0], "illum")) {
            mat->illum = atoi(mtok[1]);
        } else if (!strcmp(mtok[0], "Ke")) {
            *(yo__vec3f*)mat->ke = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ka")) {
            *(yo__vec3f*)mat->ka = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kd")) {
            *(yo__vec3f*)mat->kd = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ks")) {
            *(yo__vec3f*)mat->ks = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Kr")) {
            *(yo__vec3f*)mat->kr = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            *(yo__vec3f*)mat->kt = yo__parse_float3(mtok + 1);
        } else if (!strcmp(mtok[0], "Ns")) {
            mat->ns = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "d")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Tr")) {
            mat->op = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "Ni")) {
            mat->ior = yo__parse_float(mtok + 1);
        } else if (!strcmp(mtok[0], "map_Ke")) {
            mat->ke_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ka")) {
            mat->ka_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kd")) {
            mat->kd_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ks")) {
            mat->ks_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Kr")) {
            mat->kr_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->kt_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ns")) {
            mat->ns_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_d")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Tr")) {
            mat->op_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_Ni")) {
            mat->ior_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_bump")) {
            mat->bump_txt = yo__strdup(mtok[1]);
        } else if (!strcmp(mtok[0], "map_disp")) {
            mat->disp_txt = yo__strdup(mtok[1]);
        } else {
            // printf("ignoring value for %s\n", mtok[0]);
        }
    }

    fclose(mfile);

    return scene;
}